

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiKeyData * ImGui::GetKeyData(ImGuiKey key)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  int local_24;
  bool local_1d;
  int local_1c;
  int index;
  ImGuiContext *g;
  ImGuiKey key_local;
  
  pIVar1 = GImGui;
  local_1d = 0x284 < (uint)key;
  if (local_1d) {
    __assert_fail("key >= ImGuiKey_LegacyNativeKey_BEGIN && key < ImGuiKey_NamedKey_END",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x1fc9,"ImGuiKeyData *ImGui::GetKeyData(ImGuiKey)");
  }
  bVar2 = IsLegacyKey(key);
  local_1c = key;
  if (bVar2) {
    local_24 = key;
    if ((pIVar1->IO).KeyMap[key] != -1) {
      local_24 = (pIVar1->IO).KeyMap[key];
    }
    local_1c = local_24;
  }
  return (pIVar1->IO).KeysData + local_1c;
}

Assistant:

ImGuiKeyData* ImGui::GetKeyData(ImGuiKey key)
{
    ImGuiContext& g = *GImGui;
    int index;
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT(key >= ImGuiKey_LegacyNativeKey_BEGIN && key < ImGuiKey_NamedKey_END);
    if (IsLegacyKey(key))
        index = (g.IO.KeyMap[key] != -1) ? g.IO.KeyMap[key] : key; // Remap native->imgui or imgui->native
    else
        index = key;
#else
    IM_ASSERT(IsNamedKey(key) && "Support for user key indices was dropped in favor of ImGuiKey. Please update backend & user code.");
    index = key - ImGuiKey_NamedKey_BEGIN;
#endif
    return &g.IO.KeysData[index];
}